

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::updateTransitionMatrices
          (BeagleCPUImpl<double,_2,_0> *this,int eigenIndex,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,int count)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  
  (**(code **)(**(long **)(in_RDI + 0x70) + 0x18))
            (*(long **)(in_RDI + 0x70),in_ESI,in_RDX,in_RCX,in_R8,in_R9,
             **(undefined8 **)(in_RDI + 0x78),*(undefined8 *)(in_RDI + 0xd8));
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::updateTransitionMatrices(int eigenIndex,
                                            const int* probabilityIndices,
                                            const int* firstDerivativeIndices,
                                            const int* secondDerivativeIndices,
                                            const double* edgeLengths,
                                            int count) {
    // for (int i = 0; i < count; i++) {
    //     printf("uTM %d %d %f %d\n", eigenIndex, probabilityIndices[i], edgeLengths[i], 0);
    // }

    gEigenDecomposition->updateTransitionMatrices(eigenIndex,probabilityIndices,firstDerivativeIndices,secondDerivativeIndices,
                                                  edgeLengths,gCategoryRates[0],gTransitionMatrices,count);
    return BEAGLE_SUCCESS;
}